

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::Compaction(Compaction *this,Options *options,int level)

{
  long lVar1;
  Options *pOVar2;
  uint64_t uVar3;
  undefined4 in_EDX;
  VersionEdit *in_RSI;
  Options *in_RDI;
  long in_FS_OFFSET;
  int i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  Options *local_28;
  int local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&in_RDI->comparator = in_EDX;
  uVar3 = MaxFileSizeForLevel(in_RDI,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  in_RDI->create_if_missing = (bool)(char)uVar3;
  in_RDI->error_if_exists = (bool)(char)(uVar3 >> 8);
  in_RDI->paranoid_checks = (bool)(char)(uVar3 >> 0x10);
  *(int5 *)&in_RDI->field_0xb = (int5)(uVar3 >> 0x18);
  in_RDI->env = (Env *)0x0;
  VersionEdit::VersionEdit(in_RSI);
  local_28 = in_RDI + 2;
  pOVar2 = in_RDI + 2;
  do {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              (in_stack_ffffffffffffffb8);
    local_28 = (Options *)&local_28->info_log;
  } while (local_28 != (Options *)&pOVar2->block_cache);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
            (in_stack_ffffffffffffffb8);
  in_RDI[2].max_file_size = 0;
  *(undefined1 *)&in_RDI[2].compression = kNoCompression;
  in_RDI[2].filter_policy = (FilterPolicy *)0x0;
  for (local_20 = 0; local_20 < 7; local_20 = local_20 + 1) {
    (&in_RDI[3].comparator)[local_20] = (Comparator *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Compaction::Compaction(const Options* options, int level)
    : level_(level),
      max_output_file_size_(MaxFileSizeForLevel(options, level)),
      input_version_(nullptr),
      grandparent_index_(0),
      seen_key_(false),
      overlapped_bytes_(0) {
  for (int i = 0; i < config::kNumLevels; i++) {
    level_ptrs_[i] = 0;
  }
}